

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

FieldEntry *
google::protobuf::internal::TcParser::FindFieldEntry(TcParseTableBase *table,uint32_t field_num)

{
  ushort uVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  uint uVar6;
  
  lVar2 = (long)&table->has_bits_offset + (ulong)table->field_entries_offset;
  uVar3 = field_num - 1;
  if (uVar3 < 0x20) {
    if ((table->skipmap32 >> (uVar3 & 0x1f) & 1) == 0) {
      if (lVar2 == 0) {
        protobuf_assumption_failed
                  ("entry != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x109);
      }
      uVar4 = table->skipmap32 & (1 << ((byte)uVar3 & 0x1f)) - 1U;
      uVar4 = uVar4 - (uVar4 >> 1 & 0x55555555);
      uVar4 = (uVar4 >> 2 & 0x33333333) + (uVar4 & 0x33333333);
      uVar3 = uVar3 - (((uVar4 >> 4) + uVar4 & 0xf0f0f0f) * 0x1010101 >> 0x18);
LAB_002692b7:
      return (FieldEntry *)(lVar2 + (ulong)uVar3 * 0xc);
    }
  }
  else {
    for (puVar5 = (uint *)((long)&table->has_bits_offset + (ulong)table->lookup_table_offset);
        *puVar5 <= field_num;
        puVar5 = (uint *)((long)puVar5 + (ulong)(uint)(ushort)puVar5[1] * 4 + 6)) {
      uVar3 = field_num - *puVar5 >> 4;
      if (uVar3 < (ushort)puVar5[1]) {
        uVar1 = *(ushort *)((long)puVar5 + (ulong)uVar3 * 4 + 6);
        uVar4 = field_num - *puVar5 & 0xf;
        if ((uVar1 >> uVar4 & 1) != 0) {
          return (FieldEntry *)0x0;
        }
        if (lVar2 == 0) {
          protobuf_assumption_failed
                    ("entry != nullptr",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                     ,0x127);
        }
        uVar6 = (1 << (sbyte)uVar4) - 1U & (uint)uVar1;
        uVar6 = uVar6 - (uVar6 >> 1 & 0x5555);
        uVar6 = (uVar6 >> 2 & 0x33333333) + (uVar6 & 0x33333333);
        uVar3 = (uVar4 - (((uVar6 >> 4) + uVar6 & 0xf0f0f0f) * 0x1010101 >> 0x18)) +
                (uint)*(ushort *)((long)puVar5 + (ulong)(uVar3 * 2) * 2 + 8);
        goto LAB_002692b7;
      }
    }
  }
  return (FieldEntry *)0x0;
}

Assistant:

const TcParseTableBase::FieldEntry* TcParser::FindFieldEntry(
    const TcParseTableBase* table, uint32_t field_num) {
  const FieldEntry* const field_entries = table->field_entries_begin();

  uint32_t fstart = 1;
  uint32_t adj_fnum = field_num - fstart;

  if (ABSL_PREDICT_TRUE(adj_fnum < 32)) {
    uint32_t skipmap = table->skipmap32;
    uint32_t skipbit = 1 << adj_fnum;
    if (ABSL_PREDICT_FALSE(skipmap & skipbit)) return nullptr;
    skipmap &= skipbit - 1;
    adj_fnum -= absl::popcount(skipmap);
    auto* entry = field_entries + adj_fnum;
    PROTOBUF_ASSUME(entry != nullptr);
    return entry;
  }
  const uint16_t* lookup_table = table->field_lookup_begin();
  for (;;) {
#ifdef ABSL_IS_LITTLE_ENDIAN
    memcpy(&fstart, lookup_table, sizeof(fstart));
#else
    fstart = lookup_table[0] | (lookup_table[1] << 16);
#endif
    lookup_table += sizeof(fstart) / sizeof(*lookup_table);
    uint32_t num_skip_entries = *lookup_table++;
    if (field_num < fstart) return nullptr;
    adj_fnum = field_num - fstart;
    uint32_t skip_num = adj_fnum / 16;
    if (ABSL_PREDICT_TRUE(skip_num < num_skip_entries)) {
      // for each group of 16 fields we have:
      // a bitmap of 16 bits
      // a 16-bit field-entry offset for the first of them.
      auto* skip_data = lookup_table + (adj_fnum / 16) * (sizeof(SkipEntry16) /
                                                          sizeof(uint16_t));
      SkipEntry16 se = {skip_data[0], skip_data[1]};
      adj_fnum &= 15;
      uint32_t skipmap = se.skipmap;
      uint16_t skipbit = 1 << adj_fnum;
      if (ABSL_PREDICT_FALSE(skipmap & skipbit)) return nullptr;
      skipmap &= skipbit - 1;
      adj_fnum += se.field_entry_offset;
      adj_fnum -= absl::popcount(skipmap);
      auto* entry = field_entries + adj_fnum;
      PROTOBUF_ASSUME(entry != nullptr);
      return entry;
    }
    lookup_table +=
        num_skip_entries * (sizeof(SkipEntry16) / sizeof(*lookup_table));
  }
}